

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Joint::Joint(Joint *this,Skeleton *s)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Vector3D *value;
  Spline<CS248::Vector3D> *in_stack_ffffffffffffffb0;
  SceneObject *in_stack_ffffffffffffffc0;
  Vector3D local_38;
  undefined8 local_10;
  
  local_10 = in_RSI;
  SceneObject::SceneObject(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_set_draw_styles_00395820;
  value = (Vector3D *)(in_RDI + 0x1e);
  std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::vector
            ((vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_> *)
             0x216eed);
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0x21));
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0x24));
  in_RDI[0x28] = local_10;
  in_RDI[0x2a] = 0x3fa999999999999a;
  in_RDI[0x2b] = 0x3ff0000000000000;
  Vector3D::Vector3D(&local_38,1.0,1.0,1.0);
  in_RDI[10] = local_38.z;
  in_RDI[8] = local_38.x;
  in_RDI[9] = local_38.y;
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffffb0,(Vector3D *)(in_RDI + 8));
  Spline<CS248::Vector3D>::setValue(in_stack_ffffffffffffffb0,(double)in_RDI,value);
  return;
}

Assistant:

Joint::Joint(Skeleton* s) : skeleton(s), capsuleRadius(0.05), renderScale(1.0) {
  scale = Vector3D(1., 1., 1.);
  scales.setValue(0, scale);
}